

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void grow_hash(archive_entry_linkresolver *res)

{
  undefined8 *puVar1;
  ulong __nmemb;
  void *pvVar2;
  ulong uVar3;
  long *in_RDI;
  size_t bucket;
  size_t i;
  size_t new_size;
  links_entry **new_buckets;
  links_entry *le;
  ulong local_28;
  
  __nmemb = in_RDI[3] * 2;
  if (((ulong)in_RDI[3] <= __nmemb) && (pvVar2 = calloc(__nmemb,8), pvVar2 != (void *)0x0)) {
    for (local_28 = 0; local_28 < (ulong)in_RDI[3]; local_28 = local_28 + 1) {
      while (*(long *)(*in_RDI + local_28 * 8) != 0) {
        puVar1 = *(undefined8 **)(*in_RDI + local_28 * 8);
        *(undefined8 *)(*in_RDI + local_28 * 8) = *puVar1;
        uVar3 = puVar1[4] & __nmemb - 1;
        if (*(long *)((long)pvVar2 + uVar3 * 8) != 0) {
          *(undefined8 **)(*(long *)((long)pvVar2 + uVar3 * 8) + 8) = puVar1;
        }
        *puVar1 = *(undefined8 *)((long)pvVar2 + uVar3 * 8);
        puVar1[1] = 0;
        *(undefined8 **)((long)pvVar2 + uVar3 * 8) = puVar1;
      }
    }
    free((void *)*in_RDI);
    *in_RDI = (long)pvVar2;
    in_RDI[3] = __nmemb;
  }
  return;
}

Assistant:

static void
grow_hash(struct archive_entry_linkresolver *res)
{
	struct links_entry *le, **new_buckets;
	size_t new_size;
	size_t i, bucket;

	/* Try to enlarge the bucket list. */
	new_size = res->number_buckets * 2;
	if (new_size < res->number_buckets)
		return;
	new_buckets = calloc(new_size, sizeof(struct links_entry *));

	if (new_buckets == NULL)
		return;

	for (i = 0; i < res->number_buckets; i++) {
		while (res->buckets[i] != NULL) {
			/* Remove entry from old bucket. */
			le = res->buckets[i];
			res->buckets[i] = le->next;

			/* Add entry to new bucket. */
			bucket = le->hash & (new_size - 1);

			if (new_buckets[bucket] != NULL)
				new_buckets[bucket]->previous = le;
			le->next = new_buckets[bucket];
			le->previous = NULL;
			new_buckets[bucket] = le;
		}
	}
	free(res->buckets);
	res->buckets = new_buckets;
	res->number_buckets = new_size;
}